

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_startCase(qpTestLog *log,char *testCasePath,qpTestCaseType testCaseType)

{
  deBool dVar1;
  char *value;
  long lVar2;
  undefined1 local_198 [16];
  char *local_188;
  char *local_180;
  undefined1 local_178 [16];
  char *local_168;
  char *local_160;
  undefined1 local_158 [16];
  char *local_148;
  char *local_140;
  undefined1 local_138 [8];
  qpXmlAttribute resultAttribs [8];
  int numResultAttribs;
  char *typeStr;
  qpTestCaseType testCaseType_local;
  char *testCasePath_local;
  qpTestLog *log_local;
  
  value = qpLookupString(s_qpTestTypeMap,5,testCaseType);
  resultAttribs[7].boolValue = 0;
  deMutex_lock(log->lock);
  qpXmlWriter_flush(log->writer);
  fprintf((FILE *)log->outputFile,"\n#beginTestCaseResult %s\n",testCasePath);
  if ((log->flags & 4) == 0) {
    qpTestLog_flushFile(log);
  }
  log->isCaseOpen = 1;
  lVar2 = (long)resultAttribs[7].boolValue;
  resultAttribs[7].boolValue = resultAttribs[7].boolValue + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_158,"Version",LOG_FORMAT_VERSION);
  resultAttribs[lVar2 + -1].intValue = local_158._0_4_;
  resultAttribs[lVar2 + -1].boolValue = local_158._4_4_;
  resultAttribs[lVar2].name = (char *)local_158._8_8_;
  *(char **)&resultAttribs[lVar2].type = local_148;
  resultAttribs[lVar2].stringValue = local_140;
  lVar2 = (long)resultAttribs[7].boolValue;
  resultAttribs[7].boolValue = resultAttribs[7].boolValue + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_178,"CasePath",testCasePath);
  resultAttribs[lVar2 + -1].intValue = local_178._0_4_;
  resultAttribs[lVar2 + -1].boolValue = local_178._4_4_;
  resultAttribs[lVar2].name = (char *)local_178._8_8_;
  *(char **)&resultAttribs[lVar2].type = local_168;
  resultAttribs[lVar2].stringValue = local_160;
  lVar2 = (long)resultAttribs[7].boolValue;
  resultAttribs[7].boolValue = resultAttribs[7].boolValue + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_198,"CaseType",value);
  resultAttribs[lVar2 + -1].intValue = local_198._0_4_;
  resultAttribs[lVar2 + -1].boolValue = local_198._4_4_;
  resultAttribs[lVar2].name = (char *)local_198._8_8_;
  *(char **)&resultAttribs[lVar2].type = local_188;
  resultAttribs[lVar2].stringValue = local_180;
  dVar1 = qpXmlWriter_startDocument(log->writer);
  if ((dVar1 != 0) &&
     (dVar1 = qpXmlWriter_startElement
                        (log->writer,"TestCaseResult",resultAttribs[7].boolValue,
                         (qpXmlAttribute *)local_138), dVar1 != 0)) {
    deMutex_unlock(log->lock);
    return 1;
  }
  qpPrintf("qpTestLog_startCase(): Writing XML failed\n");
  deMutex_unlock(log->lock);
  return 0;
}

Assistant:

deBool qpTestLog_startCase (qpTestLog* log, const char* testCasePath, qpTestCaseType testCaseType)
{
	const char*		typeStr				= QP_LOOKUP_STRING(s_qpTestTypeMap, testCaseType);
	int				numResultAttribs	= 0;
	qpXmlAttribute	resultAttribs[8];

	DE_ASSERT(log && testCasePath && (testCasePath[0] != 0));
	deMutex_lock(log->lock);

	DE_ASSERT(!log->isCaseOpen);
	DE_ASSERT(ContainerStack_isEmpty(&log->containerStack));

	/* Flush XML and write out #beginTestCaseResult. */
	qpXmlWriter_flush(log->writer);
	fprintf(log->outputFile, "\n#beginTestCaseResult %s\n", testCasePath);
	if (!(log->flags & QP_TEST_LOG_NO_FLUSH))
		qpTestLog_flushFile(log);

	log->isCaseOpen = DE_TRUE;

	/* Fill in attributes. */
	resultAttribs[numResultAttribs++] = qpSetStringAttrib("Version", LOG_FORMAT_VERSION);
	resultAttribs[numResultAttribs++] = qpSetStringAttrib("CasePath", testCasePath);
	resultAttribs[numResultAttribs++] = qpSetStringAttrib("CaseType", typeStr);

	if (!qpXmlWriter_startDocument(log->writer) ||
		!qpXmlWriter_startElement(log->writer, "TestCaseResult", numResultAttribs, resultAttribs))
	{
		qpPrintf("qpTestLog_startCase(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}